

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O2

void __thiscall
helix::order_book::
remove<std::map<unsigned_long,helix::price_level,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
          (order_book *this,order *o,
          map<unsigned_long,_helix::price_level,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
          *levels)

{
  uint64_t *puVar1;
  iterator __position;
  invalid_argument *this_00;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
               ::find(&levels->_M_t,&o->price);
  if ((_Rb_tree_header *)__position._M_node == &(levels->_M_t)._M_impl.super__Rb_tree_header) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_60,"invalid price: ",&local_81);
    std::__cxx11::to_string(&local_80,o->price);
    std::operator+(&local_40,&local_60,&local_80);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar1 = &o->level->size;
  *puVar1 = *puVar1 - o->quantity;
  if (__position._M_node[1]._M_left != (_Base_ptr)0x0) {
    return;
  }
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,helix::price_level>,std::_Select1st<std::pair<unsigned_long_const,helix::price_level>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
                      *)levels,__position);
  return;
}

Assistant:

void order_book::remove(const order& o, T& levels)
{
    auto it = levels.find(o.price);
    if (it == levels.end()) {
        throw std::invalid_argument(std::string("invalid price: ") + std::to_string(o.price));
    }
    auto&& level = it->second;
    o.level->size -= o.quantity;
    if (level.size == 0) {
        levels.erase(it);
    }
}